

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::printBlock(JSPrinter *this,Ref node)

{
  size_t sVar1;
  undefined8 *puVar2;
  Value *local_18;
  Ref node_local;
  
  local_18 = node.inst;
  if ((node.inst)->type == Array) {
    if (((((node.inst)->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).
        usedElements != 1) {
      puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_18);
      if (*(int *)*puVar2 != 2) goto LAB_00177c86;
      if (*(long *)(*(long *)((int *)*puVar2 + 2) + 8) != 0) {
        maybeSpace(this,'{');
        ensure(this,1);
        sVar1 = this->used;
        this->used = sVar1 + 1;
        this->buffer[sVar1] = '{';
        this->indent = this->indent + 1;
        newline(this);
        puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_18);
        printStats(this,(Value *)*puVar2);
        this->indent = this->indent + -1;
        newline(this);
        emit(this,'}');
        return;
      }
    }
    emit(this,"{}");
    return;
  }
LAB_00177c86:
  __assert_fail("isArray()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x19a,"size_t cashew::Value::size()");
}

Assistant:

void printBlock(Ref node) {
    if (node->size() == 1 || node[1]->size() == 0) {
      emit("{}");
      return;
    }
    emit('{');
    indent++;
    newline();
    printStats(node[1]);
    indent--;
    newline();
    emit('}');
  }